

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int eval_predicate(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                  lyxp_set *set,int options)

{
  uint32_t uVar1;
  uint8_t **ppuVar2;
  uint8_t *puVar3;
  lyxp_set_nodes *plVar4;
  longdouble lVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  void *pvVar11;
  ulong uVar12;
  LY_ERR *pLVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  lys_module *plVar17;
  uint uVar18;
  char *pcVar19;
  long lVar20;
  ushort uVar21;
  uint32_t uVar22;
  int iVar23;
  undefined1 local_b8 [8];
  lyxp_set set2;
  void *local_38;
  
  set2._40_8_ = param_4;
  if ('\x02' < ly_log_level) {
    pcVar19 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar19 = "skipped";
    }
    pcVar10 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_predicate",pcVar19,pcVar10,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  uVar7 = (uint)*exp_idx;
  uVar14 = *exp_idx + 1;
  *exp_idx = uVar14;
  if (set == (lyxp_set *)0x0) {
    iVar23 = eval_expr(exp,exp_idx,cur_node,(lys_module *)set2._40_8_,(lyxp_set *)0x0,options);
    if (iVar23 != 0) {
      return iVar23;
    }
  }
  else if (set->type == LYXP_SET_NODE_SET) {
    iVar23 = set_sort(set,cur_node,options);
    if (1 < iVar23) {
      pLVar13 = ly_errno_location();
      *pLVar13 = LY_EINT;
      ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).","eval_predicate");
    }
    uVar14 = *exp_idx;
    uVar8 = (uint)uVar14;
    uVar7 = uVar8;
    do {
      uVar18 = uVar7;
      uVar7 = uVar18 + 1;
    } while (exp->tokens[(ulong)uVar18 & 0xffff] != LYXP_TOKEN_BRACK2);
    iVar23 = (uVar18 & 0xffff) - uVar8;
    local_38 = calloc((long)iVar23,8);
    if (local_38 == (void *)0x0) {
LAB_0016ed18:
      pLVar13 = ly_errno_location();
      *pLVar13 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
      return -1;
    }
    if (0 < iVar23) {
      ppuVar2 = exp->repeat;
      uVar7 = 0;
      do {
        uVar12 = (ulong)uVar7;
        puVar3 = ppuVar2[uVar7 + uVar8];
        if (puVar3 != (uint8_t *)0x0) {
          bVar6 = 0;
          do {
            uVar16 = (ulong)bVar6;
            bVar6 = bVar6 + 1;
          } while (puVar3[uVar16] != '\0');
          pvVar11 = malloc((ulong)bVar6);
          uVar21 = (ushort)uVar7;
          *(void **)((long)local_38 + uVar12 * 8) = pvVar11;
          if (pvVar11 == (void *)0x0) {
            pLVar13 = ly_errno_location();
            *pLVar13 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
            while (uVar21 != 0) {
              free((void *)0x0);
              uVar21 = (short)uVar12 - 1;
              uVar12 = (ulong)uVar21;
            }
            goto LAB_0016efe0;
          }
          memcpy(pvVar11,puVar3,(ulong)bVar6);
        }
        uVar7 = uVar7 + 1 & 0xffff;
      } while ((int)uVar7 < iVar23);
    }
    uVar1 = set->used;
    if (uVar1 != 0) {
      uVar18 = 1;
      uVar22 = 0;
      uVar7 = 0;
      do {
        local_b8._0_4_ = LYXP_SET_EMPTY;
        plVar4 = (set->val).nodes;
        uVar12 = (ulong)((uVar7 & 0xffff) << 4);
        set_insert_node((lyxp_set *)local_b8,*(void **)((long)&plVar4->node + uVar12),
                        *(uint32_t *)((long)&plVar4->pos + uVar12),
                        *(lyxp_node_type *)((long)&plVar4->type + uVar12),0);
        *exp_idx = uVar14;
        set2.used = uVar18;
        set2.size = uVar1;
        if (0 < iVar23) {
          uVar12 = 0;
          do {
            pvVar11 = *(void **)((long)local_38 + uVar12 * 8);
            if (pvVar11 != (void *)0x0) {
              bVar6 = 0;
              do {
                uVar16 = (ulong)bVar6;
                bVar6 = bVar6 + 1;
              } while (*(char *)((long)pvVar11 + uVar16) != '\0');
              memcpy(exp->repeat[(int)uVar12 + uVar8],pvVar11,(ulong)bVar6);
            }
            uVar15 = (int)uVar12 + 1U & 0xffff;
            uVar12 = (ulong)uVar15;
          } while ((int)uVar15 < iVar23);
        }
        plVar17 = (lys_module *)set2._40_8_;
        iVar9 = eval_expr(exp,exp_idx,cur_node,(lys_module *)set2._40_8_,(lyxp_set *)local_b8,
                          options);
        if (iVar9 != 0) {
          if (0 < iVar23) {
            lVar20 = 0;
            do {
              free(*(void **)((long)local_38 + lVar20 * 8));
              lVar20 = lVar20 + 1;
            } while ((int)lVar20 < iVar23);
          }
          free(local_38);
          goto LAB_0016ed0e;
        }
        if (local_b8._0_4_ == LYXP_SET_NUMBER) {
          lVar5 = ROUND((longdouble)set2._8_10_);
          set2._8_10_ = (longdouble)0;
          if ((long)lVar5 == (ulong)uVar18) {
            set2._8_10_ = (longdouble)1;
          }
        }
        lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_BOOLEAN,cur_node,plVar17,options);
        if (set2._8_4_ == 0) {
          set_remove_node(set,uVar22);
        }
        else {
          uVar7 = uVar7 + 1;
        }
        uVar18 = uVar18 + 1;
        uVar22 = uVar7 & 0xffff;
      } while (uVar22 < set->used);
    }
    if (0 < iVar23) {
      lVar20 = 0;
      do {
        free(*(void **)((long)local_38 + lVar20 * 8));
        lVar20 = lVar20 + 1;
      } while ((int)lVar20 < iVar23);
    }
    free(local_38);
  }
  else if (set->type == LYXP_SET_SNODE_SET) {
    do {
      uVar7 = uVar7 + 1;
    } while (exp->tokens[uVar7 & 0xffff] != LYXP_TOKEN_BRACK2);
    uVar8 = (uint)uVar14;
    iVar23 = (uVar7 & 0xffff) - uVar8;
    local_38 = calloc((long)iVar23,8);
    if (local_38 == (void *)0x0) goto LAB_0016ed18;
    if (0 < iVar23) {
      ppuVar2 = exp->repeat;
      uVar7 = 0;
      do {
        uVar12 = (ulong)uVar7;
        puVar3 = ppuVar2[uVar7 + uVar8];
        if (puVar3 != (uint8_t *)0x0) {
          bVar6 = 0;
          do {
            uVar16 = (ulong)bVar6;
            bVar6 = bVar6 + 1;
          } while (puVar3[uVar16] != '\0');
          pvVar11 = malloc((ulong)bVar6);
          uVar21 = (ushort)uVar7;
          *(void **)((long)local_38 + uVar12 * 8) = pvVar11;
          if (pvVar11 == (void *)0x0) {
            pLVar13 = ly_errno_location();
            *pLVar13 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
            while (uVar21 != 0) {
              free((void *)0x0);
              uVar21 = (short)uVar12 - 1;
              uVar12 = (ulong)uVar21;
            }
LAB_0016efe0:
            free(local_38);
            return -1;
          }
          memcpy(pvVar11,puVar3,(ulong)bVar6);
        }
        uVar7 = uVar7 + 1 & 0xffff;
      } while ((int)uVar7 < iVar23);
    }
    uVar12 = (ulong)set->used;
    if (uVar12 != 0) {
      uVar7 = 3;
      do {
        lVar20 = 0;
        while (uVar18 = *(uint *)((long)&((set->val).nodes)->pos + lVar20), uVar18 < uVar7) {
          lVar20 = lVar20 + 0x10;
          if (uVar12 << 4 == lVar20) goto LAB_0016eda2;
        }
        uVar7 = uVar18 + 1;
      } while( true );
    }
    uVar7 = 3;
LAB_0016eda2:
    if (uVar12 != 0) {
      lVar20 = 0;
      do {
        if (*(int *)((long)&((set->val).nodes)->pos + lVar20) == 1) {
          *(uint *)((long)&((set->val).nodes)->pos + lVar20) = uVar7;
        }
        lVar20 = lVar20 + 0x10;
      } while (uVar12 << 4 != lVar20);
    }
    uVar18 = set->used;
    if (uVar18 != 0) {
      uVar15 = 0;
      do {
        uVar15 = uVar15 & 0xffff;
        if (*(uint32_t *)((long)&((set->val).nodes)->pos + (ulong)(uVar15 << 4)) == uVar7) {
          *(undefined4 *)((long)&((set->val).nodes)->pos + (ulong)(uVar15 << 4)) = 1;
          *exp_idx = uVar14;
          if (0 < iVar23) {
            uVar12 = 0;
            do {
              pvVar11 = *(void **)((long)local_38 + uVar12 * 8);
              if (pvVar11 != (void *)0x0) {
                bVar6 = 0;
                do {
                  uVar16 = (ulong)bVar6;
                  bVar6 = bVar6 + 1;
                } while (*(char *)((long)pvVar11 + uVar16) != '\0');
                memcpy(exp->repeat[(int)uVar12 + uVar8],pvVar11,(ulong)bVar6);
              }
              uVar18 = (int)uVar12 + 1U & 0xffff;
              uVar12 = (ulong)uVar18;
            } while ((int)uVar18 < iVar23);
          }
          iVar9 = eval_expr(exp,exp_idx,cur_node,(lys_module *)set2._40_8_,set,options);
          if (iVar9 != 0) {
            if (0 < iVar23) {
              lVar20 = 0;
              do {
                free(*(void **)((long)local_38 + lVar20 * 8));
                lVar20 = lVar20 + 1;
              } while ((int)lVar20 < iVar23);
            }
            free(local_38);
            return iVar9;
          }
          *(uint *)((long)&((set->val).nodes)->pos + (ulong)(uVar15 << 4)) = uVar7;
        }
        uVar15 = uVar15 + 1;
        uVar18 = set->used;
      } while ((uVar15 & 0xffff) < uVar18);
    }
    if (uVar18 != 0) {
      uVar14 = 0;
      do {
        uVar1 = (set->val).nodes[uVar14].pos;
        uVar22 = 0;
        if ((uVar1 == 1) || (uVar22 = 1, uVar1 == uVar7)) {
          (set->val).nodes[uVar14].pos = uVar22;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar18);
    }
    if (0 < iVar23) {
      lVar20 = 0;
      do {
        free(*(void **)((long)local_38 + lVar20 * 8));
        lVar20 = lVar20 + 1;
      } while ((int)lVar20 < iVar23);
    }
    free(local_38);
  }
  else {
    local_b8._0_4_ = LYXP_SET_EMPTY;
    set_fill_set((lyxp_set *)local_b8,set);
    plVar17 = (lys_module *)set2._40_8_;
    iVar9 = eval_expr(exp,exp_idx,cur_node,(lys_module *)set2._40_8_,(lyxp_set *)local_b8,options);
    if (iVar9 != 0) {
LAB_0016ed0e:
      lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_EMPTY,cur_node,plVar17,options);
      return iVar9;
    }
    lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_BOOLEAN,cur_node,plVar17,options);
    if (set2._8_4_ == 0) {
      lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,plVar17,options);
    }
    lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_EMPTY,cur_node,plVar17,options);
  }
  if ('\x02' < ly_log_level) {
    pcVar19 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar19 = "skipped";
    }
    pcVar10 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_predicate",pcVar19,pcVar10,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  *exp_idx = *exp_idx + 1;
  return 0;
}

Assistant:

static int
eval_predicate(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
               struct lyxp_set *set, int options)
{
    int ret;
    uint16_t i, j, orig_exp, brack2_exp;
    uint32_t orig_pos, orig_size, pred_in_ctx;
    uint8_t **pred_repeat, rep_size;
    struct lyxp_set set2;

    /* '[' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
           print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    if (!set) {
        ret = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
        if (ret) {
            return ret;
        }
    } else if (set->type == LYXP_SET_NODE_SET) {
#ifndef NDEBUG
        /* we (possibly) need the set sorted, it can affect the result (if the predicate result is a number) */
        if (set_sort(set, cur_node, options) > 1) {
            LOGERR(LY_EINT, "XPath set was expected to be sorted, but is not (%s).", __func__);
        }
#endif

        orig_exp = *exp_idx;

        /* find the predicate end */
        for (brack2_exp = orig_exp; exp->tokens[brack2_exp] != LYXP_TOKEN_BRACK2; ++brack2_exp);

        /* copy predicate repeats, since they get deleted each time (probably not an ideal solution) */
        pred_repeat = calloc(brack2_exp - orig_exp, sizeof *pred_repeat);
        if (!pred_repeat) {
            LOGMEM;
            return -1;
        }
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            if (exp->repeat[orig_exp + j]) {
                for (rep_size = 0; exp->repeat[orig_exp + j][rep_size]; ++rep_size);
                ++rep_size;
                pred_repeat[j] = malloc(rep_size * sizeof **pred_repeat);
                if (!pred_repeat[j]) {
                    LOGMEM;
                    for (i = 0; i < j; ++i) {
                        free(pred_repeat[j]);
                    }
                    free(pred_repeat);
                    return -1;
                }
                memcpy(pred_repeat[j], exp->repeat[orig_exp + j], rep_size * sizeof **pred_repeat);
            }
        }

        orig_size = set->used;
        for (i = 0, orig_pos = 1; i < set->used; ++orig_pos) {
            set2.type = LYXP_SET_EMPTY;
            set_insert_node(&set2, set->val.nodes[i].node, set->val.nodes[i].pos, set->val.nodes[i].type, 0);
            /* remember the node context position for position() and context size for last() */
            set2.ctx_pos = orig_pos;
            set2.ctx_size = orig_size;
            *exp_idx = orig_exp;

            /* replace repeats */
            for (j = 0; j < brack2_exp - orig_exp; ++j) {
                if (pred_repeat[j]) {
                    for (rep_size = 0; pred_repeat[j][rep_size]; ++rep_size);
                    ++rep_size;
                    memcpy(exp->repeat[orig_exp + j], pred_repeat[j], rep_size * sizeof **pred_repeat);
                }
            }

            ret = eval_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
            if (ret) {
                for (j = 0; j < brack2_exp - orig_exp; ++j) {
                    free(pred_repeat[j]);
                }
                free(pred_repeat);
                lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
                return ret;
            }

            /* number is a position */
            if (set2.type == LYXP_SET_NUMBER) {
                if ((long long)set2.val.num == orig_pos) {
                    set2.val.num = 1;
                } else {
                    set2.val.num = 0;
                }
            }
            lyxp_set_cast(&set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);

            /* predicate satisfied or not? */
            if (set2.val.bool) {
                ++i;
            } else {
                set_remove_node(set, i);
            }
        }

        /* free predicate repeats */
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            free(pred_repeat[j]);
        }
        free(pred_repeat);

    } else if (set->type == LYXP_SET_SNODE_SET) {
        orig_exp = *exp_idx;

        /* find the predicate end */
        for (brack2_exp = orig_exp; exp->tokens[brack2_exp] != LYXP_TOKEN_BRACK2; ++brack2_exp);

        /* copy predicate repeats, since they get deleted each time (probably not an ideal solution) */
        pred_repeat = calloc(brack2_exp - orig_exp, sizeof *pred_repeat);
        if (!pred_repeat) {
            LOGMEM;
            return -1;
        }
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            if (exp->repeat[orig_exp + j]) {
                for (rep_size = 0; exp->repeat[orig_exp + j][rep_size]; ++rep_size);
                ++rep_size;
                pred_repeat[j] = malloc(rep_size * sizeof **pred_repeat);
                if (!pred_repeat[j]) {
                    LOGMEM;
                    for (i = 0; i < j; ++i) {
                        free(pred_repeat[j]);
                    }
                    free(pred_repeat);
                    return -1;
                }
                memcpy(pred_repeat[j], exp->repeat[orig_exp + j], rep_size * sizeof **pred_repeat);
            }
        }

        /* set special in_ctx to all the valid snodes */
        pred_in_ctx = set_snode_new_in_ctx(set);

        /* use the valid snodes one-by-one */
        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx != pred_in_ctx) {
                continue;
            }
            set->val.snodes[i].in_ctx = 1;

            *exp_idx = orig_exp;

            /* replace repeats */
            for (j = 0; j < brack2_exp - orig_exp; ++j) {
                if (pred_repeat[j]) {
                    for (rep_size = 0; pred_repeat[j][rep_size]; ++rep_size);
                    ++rep_size;
                    memcpy(exp->repeat[orig_exp + j], pred_repeat[j], rep_size * sizeof **pred_repeat);
                }
            }

            ret = eval_expr(exp, exp_idx, cur_node, local_mod, set, options);
            if (ret) {
                for (j = 0; j < brack2_exp - orig_exp; ++j) {
                    free(pred_repeat[j]);
                }
                free(pred_repeat);
                return ret;
            }

            set->val.snodes[i].in_ctx = pred_in_ctx;
        }

        /* restore the state as it was before the predicate */
        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx == 1) {
                set->val.snodes[i].in_ctx = 0;
            } else if (set->val.snodes[i].in_ctx == pred_in_ctx) {
                set->val.snodes[i].in_ctx = 1;
            }
        }

        /* free predicate repeats */
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            free(pred_repeat[j]);
        }
        free(pred_repeat);
    } else {
        set2.type = LYXP_SET_EMPTY;
        set_fill_set(&set2, set);

        ret = eval_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        lyxp_set_cast(&set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
        if (!set2.val.bool) {
            lyxp_set_cast(set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        }
        lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
    }

    /* ']' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
           print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    return EXIT_SUCCESS;
}